

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void FindActions(lemon *lemp)

{
  uint uVar1;
  e_assoc eVar2;
  state *psVar3;
  symbol *psVar4;
  symbol *psVar5;
  rule *prVar6;
  state **ppsVar7;
  symbol *psVar8;
  rule *prVar9;
  action *paVar10;
  action *paVar11;
  uint uVar12;
  ulong uVar13;
  action *paVar14;
  int iVar15;
  e_action eVar16;
  config *pcVar17;
  long lVar18;
  long lVar19;
  
  iVar15 = lemp->nstate;
  if (0 < iVar15) {
    lVar19 = 0;
    do {
      psVar3 = lemp->sorted[lVar19];
      pcVar17 = psVar3->cfp;
      if (pcVar17 != (config *)0x0) {
        do {
          if ((pcVar17->rp->nrhs == pcVar17->dot) && (iVar15 = lemp->nterminal, 0 < iVar15)) {
            lVar18 = 0;
            do {
              if (pcVar17->fws[lVar18] != '\0') {
                Action_add(&psVar3->ap,REDUCE,lemp->symbols[lVar18],(char *)pcVar17->rp);
                iVar15 = lemp->nterminal;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < iVar15);
          }
          pcVar17 = pcVar17->next;
        } while (pcVar17 != (config *)0x0);
        iVar15 = lemp->nstate;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar15);
  }
  if (lemp->start == (char *)0x0) {
LAB_00103ef3:
    prVar9 = lemp->startRule;
  }
  else {
    psVar8 = Symbol_find(lemp->start);
    if (psVar8 != (symbol *)0x0) goto LAB_00103efa;
    prVar9 = lemp->startRule;
    if (prVar9 == (rule *)0x0) {
      FindActions_cold_1();
      goto LAB_00103ef3;
    }
  }
  psVar8 = prVar9->lhs;
LAB_00103efa:
  Action_add(&(*lemp->sorted)->ap,ACCEPT,psVar8,(char *)0x0);
  uVar12 = lemp->nstate;
  if (0 < (int)uVar12) {
    lVar19 = 0;
    do {
      psVar3 = lemp->sorted[lVar19];
      paVar10 = psVar3->ap;
      paVar10 = (action *)msort((char *)paVar10,(char **)&paVar10->next,actioncmp);
      psVar3->ap = paVar10;
      if (paVar10 != (action *)0x0) {
LAB_00103f4b:
        paVar11 = paVar10;
        paVar10 = paVar11->next;
        if (paVar10 != (action *)0x0) {
          psVar8 = paVar11->sp;
          paVar14 = paVar10;
          do {
            if (paVar14->sp != psVar8) break;
            eVar16 = paVar11->type;
            iVar15 = 0;
            if (eVar16 == SHIFT) {
              eVar16 = paVar14->type;
              if (eVar16 == REDUCE) {
                psVar4 = ((paVar14->x).rp)->precsym;
                if (((psVar4 == (symbol *)0x0) || (uVar12 = psVar8->prec, (int)uVar12 < 0)) ||
                   (uVar1 = psVar4->prec, (int)uVar1 < 0)) {
                  paVar14->type = SRCONFLICT;
                  iVar15 = 1;
                }
                else {
                  if (uVar1 < uVar12) {
LAB_00104050:
                    paVar14->type = RD_RESOLVED;
                  }
                  else if ((uVar12 < uVar1) || (eVar2 = psVar8->assoc, eVar2 == LEFT)) {
                    paVar11->type = SH_RESOLVED;
                  }
                  else {
                    if (eVar2 != NONE) {
                      if (eVar2 != RIGHT) {
                        __assert_fail("spx->prec==spy->prec && spx->assoc==NONE",
                                      "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                                      ,0x538,
                                      "int resolve_conflict(struct action *, struct action *)");
                      }
                      goto LAB_00104050;
                    }
                    paVar11->type = ERROR;
                  }
                  iVar15 = 0;
                }
              }
              else {
                iVar15 = 0;
                if (eVar16 != SHIFT) goto LAB_00104014;
                paVar14->type = SSCONFLICT;
                eVar16 = paVar11->type;
                iVar15 = 1;
                if (eVar16 != SHIFT) goto LAB_00103f74;
              }
            }
            else {
LAB_00103f74:
              if (eVar16 == REDUCE) {
                eVar16 = paVar14->type;
                if (eVar16 == REDUCE) {
                  psVar4 = ((paVar11->x).rp)->precsym;
                  if (((psVar4 == (symbol *)0x0) ||
                      (psVar5 = ((paVar14->x).rp)->precsym, psVar5 == (symbol *)0x0)) ||
                     ((uVar12 = psVar4->prec, (int)uVar12 < 0 ||
                      ((uVar1 = psVar5->prec, (int)uVar1 < 0 || (uVar12 == uVar1)))))) {
                    paVar14->type = RRCONFLICT;
                    iVar15 = iVar15 + 1;
                  }
                  else if (uVar1 < uVar12) {
                    paVar14->type = RD_RESOLVED;
                  }
                  else if (uVar12 < uVar1) {
                    paVar11->type = RD_RESOLVED;
                  }
                }
                else {
LAB_00104014:
                  if (4 < eVar16 - SSCONFLICT) {
                    __assert_fail("apx->type==SH_RESOLVED || apx->type==RD_RESOLVED || apx->type==SSCONFLICT || apx->type==SRCONFLICT || apx->type==RRCONFLICT || apy->type==SH_RESOLVED || apy->type==RD_RESOLVED || apy->type==SSCONFLICT || apy->type==SRCONFLICT || apy->type==RRCONFLICT"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                                  ,0x553,"int resolve_conflict(struct action *, struct action *)");
                  }
                }
              }
              else if (4 < eVar16 - SSCONFLICT) {
                eVar16 = paVar14->type;
                goto LAB_00104014;
              }
            }
            lemp->nconflict = lemp->nconflict + iVar15;
            paVar14 = paVar14->next;
          } while (paVar14 != (action *)0x0);
          goto LAB_00103f4b;
        }
      }
      lVar19 = lVar19 + 1;
      uVar12 = lemp->nstate;
    } while (lVar19 < (int)uVar12);
  }
  prVar6 = lemp->rule;
  for (prVar9 = prVar6; prVar9 != (rule *)0x0; prVar9 = prVar9->next) {
    prVar9->canReduce = LEMON_FALSE;
  }
  if (0 < (int)uVar12) {
    ppsVar7 = lemp->sorted;
    uVar13 = 0;
    do {
      for (paVar10 = ppsVar7[uVar13]->ap; paVar10 != (action *)0x0; paVar10 = paVar10->next) {
        if (paVar10->type == REDUCE) {
          ((paVar10->x).rp)->canReduce = LEMON_TRUE;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar12);
  }
  for (; prVar6 != (rule *)0x0; prVar6 = prVar6->next) {
    if (prVar6->canReduce == LEMON_FALSE) {
      FindActions_cold_2();
    }
  }
  return;
}

Assistant:

void FindActions(struct lemon *lemp)
{
  int i,j;
  struct config *cfp;
  struct state *stp;
  struct symbol *sp;
  struct rule *rp;

  /* Add all of the reduce actions
  ** A reduce action is added for each element of the followset of
  ** a configuration which has its dot at the extreme right.
  */
  for(i=0; i<lemp->nstate; i++){   /* Loop over all states */
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){  /* Loop over all configurations */
      if( cfp->rp->nrhs==cfp->dot ){        /* Is dot at extreme right? */
        for(j=0; j<lemp->nterminal; j++){
          if( SetFind(cfp->fws,j) ){
            /* Add a reduce action to the state "stp" which will reduce by the
            ** rule "cfp->rp" if the lookahead symbol is "lemp->symbols[j]" */
            Action_add(&stp->ap,REDUCE,lemp->symbols[j],(char *)cfp->rp);
          }
        }
      }
    }
  }

  /* Add the accepting token */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ){
      if( lemp->startRule==0 ){
        fprintf(stderr, "internal error on source line %d: no start rule\n",
                __LINE__);
        exit(1);
      }
      sp = lemp->startRule->lhs;
    }
  }else{
    sp = lemp->startRule->lhs;
  }
  /* Add to the first state (which is always the starting state of the
  ** finite state machine) an action to ACCEPT if the lookahead is the
  ** start nonterminal.  */
  Action_add(&lemp->sorted[0]->ap,ACCEPT,sp,0);

  /* Resolve conflicts */
  for(i=0; i<lemp->nstate; i++){
    struct action *ap, *nap;
    stp = lemp->sorted[i];
    /* assert( stp->ap ); */
    stp->ap = Action_sort(stp->ap);
    for(ap=stp->ap; ap && ap->next; ap=ap->next){
      for(nap=ap->next; nap && nap->sp==ap->sp; nap=nap->next){
         /* The two actions "ap" and "nap" have the same lookahead.
         ** Figure out which one should be used */
         lemp->nconflict += resolve_conflict(ap,nap);
      }
    }
  }

  /* Report an error for each rule that can never be reduced. */
  for(rp=lemp->rule; rp; rp=rp->next) rp->canReduce = LEMON_FALSE;
  for(i=0; i<lemp->nstate; i++){
    struct action *ap;
    for(ap=lemp->sorted[i]->ap; ap; ap=ap->next){
      if( ap->type==REDUCE ) ap->x.rp->canReduce = LEMON_TRUE;
    }
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    if( rp->canReduce ) continue;
    ErrorMsg(lemp->filename,rp->ruleline,"This rule can not be reduced.\n");
    lemp->errorcnt++;
  }
}